

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O0

value * __thiscall
mjs::function_object::construct
          (value *__return_storage_ptr__,function_object *this,value *this_,
          vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  not_callable_exception *this_00;
  gc_heap *pgVar2;
  gc_function *this_01;
  gc_heap_ptr<mjs::function_object> local_70;
  gc_heap_ptr<mjs::object> local_60;
  value local_50;
  vector<mjs::value,_std::allocator<mjs::value>_> *local_28;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  value *this__local;
  function_object *this_local;
  
  local_28 = args;
  args_local = (vector<mjs::value,_std::allocator<mjs::value>_> *)this_;
  this__local = (value *)this;
  this_local = (function_object *)__return_storage_ptr__;
  bVar1 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool
                    ((gc_heap_ptr_untracked *)&this->construct_);
  if (!bVar1) {
    this_00 = (not_callable_exception *)__cxa_allocate_exception(0x10);
    pgVar2 = object::heap((object *)this);
    gc_heap::unsafe_track<mjs::function_object>((gc_heap *)&local_70,(function_object *)pgVar2);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>(&local_60,&local_70);
    value::value(&local_50,&local_60);
    not_callable_exception::not_callable_exception(this_00,&local_50);
    __cxa_throw(this_00,&not_callable_exception::typeinfo,
                not_callable_exception::~not_callable_exception);
  }
  pgVar2 = object::heap((object *)this);
  this_01 = gc_heap_ptr_untracked<mjs::gc_function,_true>::dereference(&this->construct_,pgVar2);
  gc_function::call(__return_storage_ptr__,this_01,(value *)args_local,local_28);
  return __return_storage_ptr__;
}

Assistant:

value function_object::construct(const value& this_, const std::vector<value>& args) const {
    if (!construct_) throw not_callable_exception{value{heap().unsafe_track(*this)}};
    return construct_.dereference(heap()).call(this_, args);
}